

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O2

void __thiscall
FascodeUtil::msg::_print
          (msg *this,ostream *out_stream,string *appname,string *character,string *label,
          COLOR_TYPE color,int numberspace,string *message)

{
  ostream *poVar1;
  string *this_00;
  string sStack_68;
  string local_48;
  
  this_00 = &sStack_68;
  poVar1 = std::operator<<(out_stream,"\x1b[36m[");
  poVar1 = std::operator<<(poVar1,(string *)appname);
  std::operator<<(poVar1,"]\x1b[m ");
  std::__cxx11::string::string((string *)&local_48,(string *)character);
  std::__cxx11::string::string((string *)&sStack_68,(string *)label);
  _echo_type((msg *)this_00,out_stream,&local_48,&sStack_68,numberspace,color);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  poVar1 = std::operator<<(out_stream,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void msg::_print(std::ostream& out_stream,std::string appname,std::string character,std::string label,COLOR_TYPE color,int numberspace,std::string message){

        out_stream << "\e[36m[" << appname << "]\e[m ";
        _echo_type(out_stream,character,label,numberspace,color);
        out_stream << message << std::endl;
    }